

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O3

void duckdb::DisabledCompressionMethodsSetting::SetGlobal
               (DatabaseInstance *db,DBConfig *config,Value *input)

{
  pointer pcVar1;
  DBConfig *pDVar2;
  int iVar3;
  InvalidInputException *pIVar4;
  pointer str;
  CompressionType compression_type;
  string param;
  set<duckdb::CompressionType,_std::less<duckdb::CompressionType>,_std::allocator<duckdb::CompressionType>_>
  disabled_compression_methods;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true> list
  ;
  CompressionType local_e1;
  string local_e0;
  undefined1 local_c0 [32];
  _Base_ptr p_Stack_a0;
  size_t local_98;
  string local_90;
  DBConfig *local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  Value::ToString_abi_cxx11_((string *)local_c0,input);
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,",","");
  StringUtil::Split(&local_68,(string *)local_c0,&local_e0);
  local_70 = config;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
    operator_delete((void *)local_c0._0_8_);
  }
  local_c0._24_8_ = local_c0 + 8;
  local_c0._8_4_ = _S_red;
  local_c0._16_8_ = (_Base_ptr)0x0;
  local_98 = 0;
  p_Stack_a0 = (_Base_ptr)local_c0._24_8_;
  if (local_68.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_68.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    str = local_68.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    do {
      StringUtil::Lower(&local_e0,str);
      StringUtil::Trim(&local_e0);
      if (local_e0._M_string_length == 0) {
        iVar3 = 3;
      }
      else {
        iVar3 = ::std::__cxx11::string::compare((char *)&local_e0);
        if (iVar3 == 0) {
          ::std::
          _Rb_tree<duckdb::CompressionType,_duckdb::CompressionType,_std::_Identity<duckdb::CompressionType>,_std::less<duckdb::CompressionType>,_std::allocator<duckdb::CompressionType>_>
          ::clear((_Rb_tree<duckdb::CompressionType,_duckdb::CompressionType,_std::_Identity<duckdb::CompressionType>,_std::less<duckdb::CompressionType>,_std::allocator<duckdb::CompressionType>_>
                   *)local_c0);
          iVar3 = 2;
        }
        else {
          local_e1 = CompressionTypeFromString(&local_e0);
          if (local_e1 == COMPRESSION_AUTO) {
            pIVar4 = (InvalidInputException *)__cxa_allocate_exception(0x10);
            local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_90,"Unrecognized compression method \"%s\"","");
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            pcVar1 = (str->_M_dataplus)._M_p;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_50,pcVar1,pcVar1 + str->_M_string_length);
            InvalidInputException::InvalidInputException<std::__cxx11::string>
                      (pIVar4,&local_90,&local_50);
            __cxa_throw(pIVar4,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                       );
          }
          if (local_e1 == COMPRESSION_UNCOMPRESSED) {
            pIVar4 = (InvalidInputException *)__cxa_allocate_exception(0x10);
            local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_90,"Uncompressed compression cannot be disabled","");
            InvalidInputException::InvalidInputException(pIVar4,&local_90);
            __cxa_throw(pIVar4,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                       );
          }
          ::std::
          _Rb_tree<duckdb::CompressionType,duckdb::CompressionType,std::_Identity<duckdb::CompressionType>,std::less<duckdb::CompressionType>,std::allocator<duckdb::CompressionType>>
          ::_M_insert_unique<duckdb::CompressionType_const&>
                    ((_Rb_tree<duckdb::CompressionType,duckdb::CompressionType,std::_Identity<duckdb::CompressionType>,std::less<duckdb::CompressionType>,std::allocator<duckdb::CompressionType>>
                      *)local_c0,&local_e1);
          iVar3 = 0;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p);
      }
    } while (((iVar3 == 3) || (iVar3 == 0)) &&
            (str = str + 1,
            str != local_68.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish));
  }
  pDVar2 = local_70;
  ::std::
  _Rb_tree<duckdb::CompressionType,_duckdb::CompressionType,_std::_Identity<duckdb::CompressionType>,_std::less<duckdb::CompressionType>,_std::allocator<duckdb::CompressionType>_>
  ::clear(&(local_70->options).disabled_compression_methods._M_t);
  if ((_Base_ptr)local_c0._16_8_ != (_Base_ptr)0x0) {
    (pDVar2->options).disabled_compression_methods._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_color = local_c0._8_4_;
    (pDVar2->options).disabled_compression_methods._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_parent = (_Base_ptr)local_c0._16_8_;
    (pDVar2->options).disabled_compression_methods._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_left = (_Base_ptr)local_c0._24_8_;
    (pDVar2->options).disabled_compression_methods._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_right = p_Stack_a0;
    *(_Rb_tree_header **)(local_c0._16_8_ + 8) =
         &(pDVar2->options).disabled_compression_methods._M_t._M_impl.super__Rb_tree_header;
    (pDVar2->options).disabled_compression_methods._M_t._M_impl.super__Rb_tree_header._M_node_count
         = local_98;
    local_c0._16_8_ = (_Base_ptr)0x0;
    local_c0._24_8_ = local_c0 + 8;
    local_98 = 0;
    p_Stack_a0 = (_Base_ptr)local_c0._24_8_;
  }
  ::std::
  _Rb_tree<duckdb::CompressionType,_duckdb::CompressionType,_std::_Identity<duckdb::CompressionType>,_std::less<duckdb::CompressionType>,_std::allocator<duckdb::CompressionType>_>
  ::~_Rb_tree((_Rb_tree<duckdb::CompressionType,_duckdb::CompressionType,_std::_Identity<duckdb::CompressionType>,_std::less<duckdb::CompressionType>,_std::allocator<duckdb::CompressionType>_>
               *)local_c0);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_68);
  return;
}

Assistant:

void DisabledCompressionMethodsSetting::SetGlobal(DatabaseInstance *db, DBConfig &config, const Value &input) {
	auto list = StringUtil::Split(input.ToString(), ",");
	set<CompressionType> disabled_compression_methods;
	for (auto &entry : list) {
		auto param = StringUtil::Lower(entry);
		StringUtil::Trim(param);
		if (param.empty()) {
			continue;
		}
		if (param == "none") {
			disabled_compression_methods.clear();
			break;
		}
		auto compression_type = CompressionTypeFromString(param);
		if (compression_type == CompressionType::COMPRESSION_UNCOMPRESSED) {
			throw InvalidInputException("Uncompressed compression cannot be disabled");
		}
		if (compression_type == CompressionType::COMPRESSION_AUTO) {
			throw InvalidInputException("Unrecognized compression method \"%s\"", entry);
		}
		disabled_compression_methods.insert(compression_type);
	}
	config.options.disabled_compression_methods = std::move(disabled_compression_methods);
}